

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O2

void __thiscall
sc_core::sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0>::sc_port
          (sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0> *this,
          sc_signal_in_if<bool> *interface_)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  
  sc_port_b<sc_core::sc_signal_in_if<bool>_>::sc_port_b
            (&this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>,1,SC_ONE_OR_MORE_BOUND);
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).super_sc_port_base.super_sc_object.
  _vptr_sc_object = (_func_int **)&PTR_print_00261830;
  sc_warn_port_constructor();
  sc_port_b<sc_core::sc_signal_in_if<bool>_>::bind
            (&this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>,(int)interface_,__addr,in_ECX);
  return;
}

Assistant:

explicit sc_port( IF& interface_ )
	: base_type( N, P )
	{ sc_warn_port_constructor(); base_type::bind( interface_ ); }